

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O3

errr finish_parse_act(parser *p)

{
  activation *paVar1;
  char *pcVar2;
  effect *peVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long *plVar10;
  long *plVar11;
  activation *paVar12;
  uint16_t uVar13;
  long lVar14;
  long *p_00;
  long lVar15;
  
  z_info->act_max = 0;
  plVar11 = (long *)parser_priv(p);
  uVar13 = z_info->act_max;
  if (plVar11 != (long *)0x0) {
    do {
      uVar13 = uVar13 + 1;
      plVar11 = (long *)*plVar11;
    } while (plVar11 != (long *)0x0);
    z_info->act_max = uVar13;
  }
  activations = (activation *)mem_zalloc((ulong)uVar13 * 0x38 + 0x38);
  plVar11 = (long *)parser_priv(p);
  paVar12 = activations;
  if (plVar11 != (long *)0x0) {
    paVar1 = (activation *)*plVar11;
    pcVar2 = (char *)plVar11[1];
    lVar15 = plVar11[2];
    lVar14 = plVar11[3];
    peVar3 = (effect *)plVar11[4];
    pcVar4 = (char *)plVar11[5];
    paVar12[1].index = (int)lVar15;
    paVar12[1].aim = (_Bool)(char)((ulong)lVar15 >> 0x20);
    *(int3 *)&paVar12[1].field_0x15 = (int3)((ulong)lVar15 >> 0x28);
    paVar12[1].level = (int)lVar14;
    paVar12[1].power = (int)((ulong)lVar14 >> 0x20);
    paVar12[1].desc = (char *)plVar11[6];
    paVar12[1].effect = peVar3;
    paVar12[1].message = pcVar4;
    paVar12[1].next = paVar1;
    paVar12[1].name = pcVar2;
    paVar12[1].index = L'\x01';
    lVar15 = 1;
    if ((long *)*plVar11 != (long *)0x0) {
      lVar14 = 0x70;
      plVar10 = (long *)*plVar11;
      p_00 = plVar11;
      do {
        plVar11 = plVar10;
        *(long *)((long)&paVar12[-1].next + lVar14) = (long)&paVar12->next + lVar14;
        mem_free(p_00);
        paVar12 = activations;
        lVar15 = lVar15 + 1;
        *(long *)((long)&activations->desc + lVar14) = plVar11[6];
        lVar5 = *plVar11;
        lVar6 = plVar11[1];
        lVar7 = plVar11[2];
        lVar8 = plVar11[3];
        lVar9 = plVar11[5];
        plVar10 = (long *)((long)&paVar12->effect + lVar14);
        *plVar10 = plVar11[4];
        plVar10[1] = lVar9;
        plVar10 = (long *)((long)&paVar12->index + lVar14);
        *plVar10 = lVar7;
        plVar10[1] = lVar8;
        plVar10 = (long *)((long)&paVar12->next + lVar14);
        *plVar10 = lVar5;
        plVar10[1] = lVar6;
        paVar12 = activations;
        *(int *)((long)&activations->index + lVar14) = (int)lVar15;
        lVar14 = lVar14 + 0x38;
        plVar10 = (long *)*plVar11;
        p_00 = plVar11;
      } while ((long *)*plVar11 != (long *)0x0);
    }
    paVar12[lVar15].next = (activation *)0x0;
    mem_free(plVar11);
  }
  z_info->act_max = z_info->act_max + 1;
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_act(struct parser *p) {
	struct activation *act, *next = NULL;
	int count = 1;

	/* Count the entries */
	z_info->act_max = 0;
	act = parser_priv(p);
	while (act) {
		z_info->act_max++;
		act = act->next;
	}

	/* Allocate the direct access list and copy the data to it */
	activations = mem_zalloc((z_info->act_max + 1) * sizeof(*act));
	for (act = parser_priv(p); act; act = next, count++) {
		memcpy(&activations[count], act, sizeof(*act));
		activations[count].index = count;
		next = act->next;
		if (next) {
			activations[count].next = &activations[count + 1];
		} else {
			activations[count].next = NULL;
		}
		mem_free(act);
	}
	z_info->act_max += 1;

	parser_destroy(p);
	return 0;
}